

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_thread.cc
# Opt level: O0

void __thiscall
AckThread::AddSession(AckThread *this,uint32_t session_id,string *dst_ip,uint16_t dst_port)

{
  mapped_type *this_00;
  AutoLock local_80;
  AutoLock lock;
  WaitAckSession w;
  uint16_t dst_port_local;
  string *dst_ip_local;
  AckThread *pAStack_10;
  uint32_t session_id_local;
  AckThread *this_local;
  
  dst_ip_local._4_4_ = session_id;
  pAStack_10 = this;
  WaitAckSession::WaitAckSession((WaitAckSession *)&lock,session_id,dst_ip,dst_port);
  dd::AutoLock::AutoLock(&local_80,&this->_lock);
  this_00 = std::
            unordered_map<unsigned_int,_AckThread::WaitAckSession,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AckThread::WaitAckSession>_>_>
            ::operator[](&this->_wait_ack_sessions,(key_type *)((long)&dst_ip_local + 4));
  WaitAckSession::operator=(this_00,(WaitAckSession *)&lock);
  dd::AutoLock::~AutoLock(&local_80);
  WaitAckSession::~WaitAckSession((WaitAckSession *)&lock);
  return;
}

Assistant:

void AckThread::AddSession(uint32_t session_id, std::string &dst_ip, uint16_t dst_port)
{
	WaitAckSession w(session_id, dst_ip, dst_port);
	dd::AutoLock lock(_lock);
	_wait_ack_sessions[session_id] = w;
}